

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::get_token_string(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *this)

{
  bool bVar1;
  byte *pbVar2;
  size_type __maxlen;
  pointer pvVar3;
  long in_RSI;
  string *in_RDI;
  array<char,_9UL> cs;
  char c;
  const_iterator __end0;
  const_iterator __begin0;
  vector<char,_std::allocator<char>_> *__range3;
  string *result;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  array<char,_9UL> *in_stack_ffffffffffffff90;
  array<char,_9UL> local_40;
  byte local_31;
  char *local_30;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string(in_RDI);
  local_20 = in_RSI + 0x38;
  local_28._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffff88);
  local_30 = (char *)std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                             *)in_stack_ffffffffffffff90,
                            (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    pbVar2 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                     operator*(&local_28);
    local_31 = *pbVar2;
    if (local_31 < 0x20) {
      local_40._M_elems[8] = '\0';
      local_40._M_elems[0] = '\0';
      local_40._M_elems[1] = '\0';
      local_40._M_elems[2] = '\0';
      local_40._M_elems[3] = '\0';
      local_40._M_elems[4] = '\0';
      local_40._M_elems[5] = '\0';
      local_40._M_elems[6] = '\0';
      local_40._M_elems[7] = '\0';
      in_stack_ffffffffffffff90 = &local_40;
      in_stack_ffffffffffffff88 =
           (vector<char,_std::allocator<char>_> *)
           std::array<char,_9UL>::data((array<char,_9UL> *)0x1c9eba);
      __maxlen = std::array<char,_9UL>::size(in_stack_ffffffffffffff90);
      snprintf((char *)in_stack_ffffffffffffff88,__maxlen,"<U+%.4X>",(ulong)local_31);
      pvVar3 = std::array<char,_9UL>::data((array<char,_9UL> *)0x1c9eec);
      std::__cxx11::string::operator+=(in_RDI,pvVar3);
    }
    else {
      std::__cxx11::string::push_back((char)in_RDI);
    }
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&local_28);
  }
  return in_RDI;
}

Assistant:

std::string get_token_string() const
    {
        // escape control characters
        std::string result;
        for (const auto c : token_string)
        {
            if (static_cast<unsigned char>(c) <= '\x1F')
            {
                // escape control characters
                std::array<char, 9> cs{{}};
                (std::snprintf)(cs.data(), cs.size(), "<U+%.4X>", static_cast<unsigned char>(c));
                result += cs.data();
            }
            else
            {
                // add character as is
                result.push_back(static_cast<std::string::value_type>(c));
            }
        }

        return result;
    }